

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int re2::StringPieceToRune(Rune *r,StringPiece *sp,RegexpStatus *status)

{
  int iVar1;
  
  iVar1 = 4;
  if (sp->size_ < 4) {
    iVar1 = (int)sp->size_;
  }
  iVar1 = fullrune(sp->data_,iVar1);
  if (iVar1 != 0) {
    iVar1 = chartorune(r,sp->data_);
    if (*r < 0x110000) {
      if (*r != 0xfffd || iVar1 != 1) {
        sp->data_ = sp->data_ + iVar1;
        sp->size_ = sp->size_ - (long)iVar1;
        return iVar1;
      }
    }
    else {
      *r = 0xfffd;
    }
  }
  if (status != (RegexpStatus *)0x0) {
    status->code_ = kRegexpBadUTF8;
    (status->error_arg_).data_ = (const_pointer)0x0;
    (status->error_arg_).size_ = 0;
  }
  return -1;
}

Assistant:

static int StringPieceToRune(Rune *r, StringPiece *sp, RegexpStatus* status) {
  // fullrune() takes int, not size_t. However, it just looks
  // at the leading byte and treats any length >= 4 the same.
  if (fullrune(sp->data(), static_cast<int>(std::min(size_t{4}, sp->size())))) {
    int n = chartorune(r, sp->data());
    // Some copies of chartorune have a bug that accepts
    // encodings of values in (10FFFF, 1FFFFF] as valid.
    // Those values break the character class algorithm,
    // which assumes Runemax is the largest rune.
    if (*r > Runemax) {
      n = 1;
      *r = Runeerror;
    }
    if (!(n == 1 && *r == Runeerror)) {  // no decoding error
      sp->remove_prefix(n);
      return n;
    }
  }

  if (status != NULL) {
    status->set_code(kRegexpBadUTF8);
    status->set_error_arg(StringPiece());
  }
  return -1;
}